

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean detonate_obj(obj *otmp,obj *ostack,obj *olaunch,int x,int y,boolean thrown)

{
  boolean bVar1;
  int dam;
  char *pcVar2;
  bool bVar3;
  int dmg;
  boolean is_artifact;
  boolean thrown_local;
  int y_local;
  int x_local;
  obj *olaunch_local;
  obj *ostack_local;
  obj *otmp_local;
  
  bVar3 = otmp->oartifact != '\0';
  bVar1 = obj_resists(otmp,0,100);
  if ((bVar1 == '\0') || (bVar3)) {
    bVar1 = oprop_attack(0x20000,otmp,olaunch,thrown);
    if ((bVar1 == '\0') &&
       (((otmp->oprops & 0x20000U) == 0 ||
        (((((otmp->oclass != '\x02' && (otmp->oclass != '\r')) ||
           (objects[otmp->otyp].oc_subtyp < -0x18)) || (-0x16 < objects[otmp->otyp].oc_subtyp)) &&
         (((otmp->oclass != '\x02' && (otmp->oclass != '\x06')) ||
          ((objects[otmp->otyp].oc_subtyp < -0x1b || (-0x19 < objects[otmp->otyp].oc_subtyp)))))))))
       ) {
      otmp_local._7_1_ = 0;
    }
    else {
      pcVar2 = xname(otmp);
      pline("The %s explodes!",pcVar2);
      oprop_id(0x20000,otmp,ostack,olaunch);
      if (!bVar3) {
        thrownobj = (obj *)0x0;
        obfree(otmp,(obj *)0x0);
      }
      dam = dice(4,4);
      explode(x,y,0xb,dam,'\x02',5);
      scatter(x,y,dam,0x1f,(obj *)0x0);
      otmp_local._7_1_ = (bVar3 ^ 0xffU) & 1;
    }
  }
  else {
    otmp_local._7_1_ = 0;
  }
  return otmp_local._7_1_;
}

Assistant:

boolean detonate_obj(struct obj *otmp, struct obj *ostack, struct obj *olaunch,
		     int x, int y, boolean thrown)
{
	boolean is_artifact;
	int dmg;

	/* Don't destroy vital objects, but allow artifacts,
	 * e.g. the Heart of Ahriman fired from a sling of detonation . */
	is_artifact = !!otmp->oartifact;
	if (obj_resists(otmp, 0, 100) && !is_artifact)
	    return FALSE;

	if (!oprop_attack(ITEM_DETONATIONS, otmp, olaunch, thrown) &&
	    /* ammo and missiles may detonate even if dropped */
	    !((otmp->oprops & ITEM_DETONATIONS) &&
	      (is_ammo(otmp) || is_missile(otmp))))
	    return FALSE;

	pline("The %s explodes!", xname(otmp));
	oprop_id(ITEM_DETONATIONS, otmp, ostack, olaunch);

	if (!is_artifact) {
	    thrownobj = NULL;
	    obfree(otmp, NULL);
	    otmp = NULL;
	}

	/* otmp->ox and otmp->oy may not be set correctly, or even at all! */
	dmg = dice(4, 4);
	explode(x, y, ZT_SPELL(ZT_FIRE), dmg, WEAPON_CLASS, EXPL_FIERY);
	scatter(x, y, dmg, VIS_EFFECTS|MAY_HIT|MAY_DESTROY|MAY_FRACTURE, NULL);

	return !is_artifact;
}